

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

string * __thiscall
duckdb::BitpackingModeToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,BitpackingMode *mode)

{
  NotImplementedException *this_00;
  long *plVar1;
  size_type *psVar2;
  char *pcVar3;
  char *pcVar4;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  switch(*this) {
  case (duckdb)0x1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "auto";
    pcVar3 = "";
    break;
  case (duckdb)0x2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "constant";
    pcVar3 = "";
    break;
  case (duckdb)0x3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "constant_delta";
    pcVar3 = "";
    break;
  case (duckdb)0x4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "delta_for";
    pcVar3 = "";
    break;
  case (duckdb)0x5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "for";
    pcVar3 = "";
    break;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_60,(uint)(byte)*this);
    ::std::operator+(&local_40,"Unknown bitpacking mode: ",&local_60);
    plVar1 = (long *)::std::__cxx11::string::append((char *)&local_40);
    local_80._M_dataplus._M_p = (pointer)*plVar1;
    psVar2 = (size_type *)(plVar1 + 2);
    if ((size_type *)local_80._M_dataplus._M_p == psVar2) {
      local_80.field_2._M_allocated_capacity = *psVar2;
      local_80.field_2._8_8_ = plVar1[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar2;
    }
    local_80._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    NotImplementedException::NotImplementedException(this_00,&local_80);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

string BitpackingModeToString(const BitpackingMode &mode) {
	switch (mode) {
	case BitpackingMode::AUTO:
		return "auto";
	case BitpackingMode::CONSTANT:
		return "constant";
	case BitpackingMode::CONSTANT_DELTA:
		return "constant_delta";
	case BitpackingMode::DELTA_FOR:
		return "delta_for";
	case BitpackingMode::FOR:
		return "for";
	default:
		throw NotImplementedException("Unknown bitpacking mode: " + to_string((uint8_t)mode) + "\n");
	}
}